

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O0

void __thiscall Callback::Emitter::emit<MyEmitter>(Emitter *this,offset_in_MyEmitter_to_subr signal)

{
  void *pvVar1;
  bool bVar2;
  Slot *pSVar3;
  long *plVar4;
  code *local_c0;
  Iterator local_80;
  Iterator i;
  MemberFuncPtr local_68;
  undefined1 local_58 [8];
  SignalActivation activation;
  offset_in_MyEmitter_to_subr signal_local;
  Emitter *this_local;
  
  i.item = (Item *)signal;
  activation.end.item = (Item *)signal;
  MemberFuncPtr::MemberFuncPtr<void(MyEmitter::*)()>(&local_68,signal);
  SignalActivation::SignalActivation((SignalActivation *)local_58,this,&local_68);
  local_80.item = (Item *)activation.data;
  while (bVar2 = List<Callback::Emitter::Slot>::Iterator::operator!=(&local_80,&activation.begin),
        bVar2) {
    pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_80);
    if (pSVar3->state == connected) {
      pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_80);
      pvVar1 = pSVar3->object;
      pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_80);
      local_c0 = (code *)(pSVar3->slot).ptr;
      plVar4 = (long *)((long)pvVar1 + *(long *)&(pSVar3->slot).field_0x8);
      if (((ulong)local_c0 & 1) != 0) {
        local_c0 = *(code **)(local_c0 + *plVar4 + -1);
      }
      (*local_c0)(plVar4);
    }
    if (((byte)activation.next & 1) != 0) break;
    List<Callback::Emitter::Slot>::Iterator::operator++(&local_80);
  }
  SignalActivation::~SignalActivation((SignalActivation *)local_58);
  return;
}

Assistant:

void emit(void (X::*signal)()) {SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected)
      (((X*)i->object)->*((MemberFuncPtr0<X>*)&i->slot)->ptr)(); if(activation.invalidated) return;}}